

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O1

void join(string *result,string *separator,
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *items)

{
  pointer pbVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  stringstream s;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar3 = (ulong)((long)(items->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(items->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) >> 5;
  iVar2 = (int)uVar3;
  if (iVar2 != 0) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      pbVar1 = (items->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,*(char **)((long)pbVar1 + lVar4 + -8),
                 *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
      if (uVar5 < iVar2 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(separator->_M_dataplus)._M_p,separator->_M_string_length);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while ((uVar3 & 0xffffffff) != uVar5);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)result,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void join (
  std::string& result,
  const std::string& separator,
  const std::vector<std::string>& items)
{
  std::stringstream s;
  unsigned int size = items.size ();
  for (unsigned int i = 0; i < size; ++i)
  {
    s << items[i];
    if (i < size - 1)
      s << separator;
  }

  result = s.str ();
}